

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall V2Transport::SetSendState(V2Transport *this,SendState send_state)

{
  bool bVar1;
  long lVar2;
  char in_SIL;
  bool *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  int line;
  undefined7 in_stack_ffffffffffffffe0;
  bool *val;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  val = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffd7,
                                     CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),
             in_stack_ffffffffffffffcc,(AnnotatedMixin<std::mutex> *)0xffbf4b);
  bVar1 = in_RDI[0x5a0];
  line = (int)((ulong)in_RDI >> 0x20);
  if (bVar1 == false) {
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,
               (char *)(ulong)CONCAT16(in_SIL == '\x03' || in_SIL == '\x01',
                                       in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else if (bVar1 == true) {
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,
               (char *)CONCAT17(1,CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else if ((byte)(bVar1 - 2U) < 2) {
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,
               (char *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0))
               ,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  in_RDI[0x5a0] = (bool)in_SIL;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void V2Transport::SetSendState(SendState send_state) noexcept
{
    AssertLockHeld(m_send_mutex);
    // Enforce allowed state transitions.
    switch (m_send_state) {
    case SendState::MAYBE_V1:
        Assume(send_state == SendState::V1 || send_state == SendState::AWAITING_KEY);
        break;
    case SendState::AWAITING_KEY:
        Assume(send_state == SendState::READY);
        break;
    case SendState::READY:
    case SendState::V1:
        Assume(false); // Final states
        break;
    }
    // Change state.
    m_send_state = send_state;
}